

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

void __thiscall ON_ClippingPlane::Default(ON_ClippingPlane *this)

{
  long lVar1;
  ON_Plane *pOVar2;
  ON_ClippingPlane *pOVar3;
  
  pOVar2 = &ON_xy_plane;
  pOVar3 = this;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar3->m_plane).origin.x = (pOVar2->origin).x;
    pOVar2 = (ON_Plane *)&(pOVar2->origin).y;
    pOVar3 = (ON_ClippingPlane *)&(pOVar3->m_plane).origin.y;
  }
  ON_UuidList::Empty(&this->m_viewport_ids);
  (this->m_plane_id).Data1 = 0;
  (this->m_plane_id).Data2 = 0;
  (this->m_plane_id).Data3 = 0;
  (this->m_plane_id).Data4[0] = '\0';
  (this->m_plane_id).Data4[1] = '\0';
  (this->m_plane_id).Data4[2] = '\0';
  (this->m_plane_id).Data4[3] = '\0';
  (this->m_plane_id).Data4[4] = '\0';
  (this->m_plane_id).Data4[5] = '\0';
  (this->m_plane_id).Data4[6] = '\0';
  (this->m_plane_id).Data4[7] = '\0';
  this->m_bEnabled = true;
  this->m_depth_enabled = false;
  this->m_participation_lists_enabled = false;
  DeleteClippingPlaneData(&this->m_data_store);
  return;
}

Assistant:

void ON_ClippingPlane::Default()
{
  m_plane = ON_xy_plane;
  m_viewport_ids.Empty();
  m_plane_id = ON_nil_uuid;
  m_bEnabled = true;
  m_depth_enabled = false;
  m_participation_lists_enabled = false;
  DeleteClippingPlaneData(m_data_store);
}